

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               (void)

{
  pointer *pppVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  lazy_ostream *plVar6;
  undefined4 local_1120;
  Index local_111c;
  basic_cstring<const_char> local_1118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1108;
  basic_cstring<const_char> local_10e0;
  basic_cstring<const_char> local_10d0;
  undefined4 local_10c0;
  Index local_10bc;
  basic_cstring<const_char> local_10b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_10a8;
  basic_cstring<const_char> local_1080;
  basic_cstring<const_char> local_1070;
  undefined4 local_1060;
  Index local_105c;
  basic_cstring<const_char> local_1058;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1048;
  basic_cstring<const_char> local_1020;
  basic_cstring<const_char> local_1010;
  undefined4 local_1000;
  ID_index local_ffc;
  basic_cstring<const_char> local_ff8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_fe8;
  basic_cstring<const_char> local_fc0;
  basic_cstring<const_char> local_fb0;
  uint local_fa0;
  ID_index local_f9c;
  basic_cstring<const_char> local_f98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f88;
  basic_cstring<const_char> local_f60;
  basic_cstring<const_char> local_f50;
  undefined4 local_f40;
  ID_index local_f3c;
  basic_cstring<const_char> local_f38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f28;
  basic_cstring<const_char> local_f00;
  basic_cstring<const_char> local_ef0;
  undefined4 local_ee0;
  ID_index local_edc;
  basic_cstring<const_char> local_ed8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ec8;
  basic_cstring<const_char> local_ea0;
  basic_cstring<const_char> local_e90;
  uint local_e80;
  ID_index local_e7c;
  basic_cstring<const_char> local_e78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e68;
  basic_cstring<const_char> local_e40;
  basic_cstring<const_char> local_e30;
  uint local_e20;
  ID_index local_e1c;
  basic_cstring<const_char> local_e18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e08;
  basic_cstring<const_char> local_de0;
  basic_cstring<const_char> local_dd0;
  uint local_dc0;
  ID_index local_dbc;
  basic_cstring<const_char> local_db8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_da8;
  basic_cstring<const_char> local_d80;
  basic_cstring<const_char> local_d70;
  undefined4 local_d60;
  Dimension local_d5c;
  basic_cstring<const_char> local_d58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d48;
  basic_cstring<const_char> local_d20;
  basic_cstring<const_char> local_d10;
  undefined4 local_d00;
  Dimension local_cfc;
  basic_cstring<const_char> local_cf8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ce8;
  basic_cstring<const_char> local_cc0;
  basic_cstring<const_char> local_cb0;
  undefined4 local_ca0;
  Dimension local_c9c;
  basic_cstring<const_char> local_c98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c88;
  basic_cstring<const_char> local_c60;
  basic_cstring<const_char> local_c50;
  undefined4 local_c40;
  Dimension local_c3c;
  basic_cstring<const_char> local_c38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c28;
  basic_cstring<const_char> local_c00;
  basic_cstring<const_char> local_bf0;
  undefined4 local_be0;
  Dimension local_bdc;
  basic_cstring<const_char> local_bd8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bc8;
  basic_cstring<const_char> local_ba0;
  basic_cstring<const_char> local_b90;
  undefined4 local_b80;
  Dimension local_b7c;
  basic_cstring<const_char> local_b78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b68;
  basic_cstring<const_char> local_b40;
  basic_cstring<const_char> local_b30;
  undefined4 local_b20;
  Dimension local_b1c;
  basic_cstring<const_char> local_b18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b08;
  basic_cstring<const_char> local_ae0;
  basic_cstring<const_char> local_ad0;
  basic_cstring<const_char> local_ac0;
  basic_cstring<const_char> local_ab0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_aa0;
  assertion_result local_a80;
  basic_cstring<const_char> local_a68;
  basic_cstring<const_char> local_a58;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a28;
  assertion_result local_a08;
  basic_cstring<const_char> local_9f0;
  basic_cstring<const_char> local_9e0;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9b0;
  assertion_result local_990;
  basic_cstring<const_char> local_978;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  basic_cstring<const_char> local_948;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_938;
  assertion_result local_918;
  basic_cstring<const_char> local_900;
  basic_cstring<const_char> local_8f0;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8c0;
  assertion_result local_8a0;
  basic_cstring<const_char> local_888;
  basic_cstring<const_char> local_878;
  basic_cstring<const_char> local_868;
  basic_cstring<const_char> local_858;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_848;
  assertion_result local_828;
  basic_cstring<const_char> local_810;
  basic_cstring<const_char> local_800;
  basic_cstring<const_char> local_7f0;
  basic_cstring<const_char> local_7e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7d0;
  assertion_result local_7b0;
  basic_cstring<const_char> local_798;
  basic_cstring<const_char> local_788;
  basic_cstring<const_char> local_778;
  basic_cstring<const_char> local_768;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_758;
  assertion_result local_738;
  basic_cstring<const_char> local_720;
  basic_cstring<const_char> local_710;
  basic_cstring<const_char> local_700;
  basic_cstring<const_char> local_6f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6e0;
  assertion_result local_6c0;
  basic_cstring<const_char> local_6a8;
  basic_cstring<const_char> local_698;
  undefined4 local_688;
  Index local_684;
  basic_cstring<const_char> local_680;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_670;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  undefined4 local_628;
  Index local_624;
  basic_cstring<const_char> local_620;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_610;
  basic_cstring<const_char> local_5e8;
  basic_cstring<const_char> local_5d8;
  undefined4 local_5c8;
  Index local_5c4;
  basic_cstring<const_char> local_5c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5b0;
  basic_cstring<const_char> local_588;
  basic_cstring<const_char> local_578;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_548;
  assertion_result local_528;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4d0;
  assertion_result local_4b0;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  basic_cstring<const_char> local_468;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_458;
  assertion_result local_438;
  basic_cstring<const_char> local_420;
  basic_cstring<const_char> local_410;
  basic_cstring<const_char> local_400;
  basic_cstring<const_char> local_3f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3e0;
  assertion_result local_3c0;
  basic_cstring<const_char> local_3a8;
  basic_cstring<const_char> local_398;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_368;
  assertion_result local_348;
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  basic_cstring<const_char> local_310;
  basic_cstring<const_char> local_300;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2f0;
  assertion_result local_2d0;
  basic_cstring<const_char> local_2b8;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_278;
  assertion_result local_258;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  undefined1 local_220 [8];
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  m;
  value_type boundary1;
  undefined1 local_38 [8];
  value_type boundary2;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  pvVar5 = std::
           vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ::back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   *)&boundary2.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_38,pvVar5);
  pppVar1 = &boundary2.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::pop_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)pppVar1);
  pvVar5 = std::
           vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ::back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   *)pppVar1);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&m.matrix_.operators_,pvVar5);
  pppVar1 = &boundary2.
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::pop_back((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)pppVar1);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
              *)local_220,
             (vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)pppVar1,5);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_240);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_230,0x1ba,&local_240);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_258,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_278,plVar6,&local_288);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_258,&local_278,&local_298,0x1ba,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_278);
    boost::test_tools::assertion_result::~assertion_result(&local_258);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_2a8,0x1bb,&local_2b8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_2d0,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_2f0,plVar6,&local_300);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_310,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2d0,&local_2f0,&local_310,0x1bb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2f0);
    boost::test_tools::assertion_result::~assertion_result(&local_2d0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_330);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_320,0x1bc,&local_330);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,0);
    boost::test_tools::assertion_result::assertion_result(&local_348,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_368,plVar6,&local_378);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_348,&local_368,&local_388,0x1bc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_368);
    boost::test_tools::assertion_result::~assertion_result(&local_348);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_398,0x1bd,&local_3a8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,1);
    boost::test_tools::assertion_result::assertion_result(&local_3c0,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3f0,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_3e0,plVar6,&local_3f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_400,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3c0,&local_3e0,&local_400,0x1bd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3e0);
    boost::test_tools::assertion_result::~assertion_result(&local_3c0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_420);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_410,0x1be,&local_420);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,2);
    boost::test_tools::assertion_result::assertion_result(&local_438,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_458,plVar6,&local_468);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_478,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_438,&local_458,&local_478,0x1be,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_458);
    boost::test_tools::assertion_result::~assertion_result(&local_438);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_498);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_488,0x1bf,&local_498);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,3);
    boost::test_tools::assertion_result::assertion_result(&local_4b0,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_4d0,plVar6,&local_4e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4b0,&local_4d0,&local_4f0,0x1bf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4d0);
    boost::test_tools::assertion_result::~assertion_result(&local_4b0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_500,0x1c0,&local_510);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,4);
    boost::test_tools::assertion_result::assertion_result(&local_528,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,"!m.is_zero_column(4)",0x14);
    boost::unit_test::operator<<(&local_548,plVar6,&local_558);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_568,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_528,&local_548,&local_568,0x1c0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_548);
    boost::test_tools::assertion_result::~assertion_result(&local_528);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_578,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_588);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_578,0x1c2,&local_588);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5b0,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_5c4 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220);
    local_5c8 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_5b0,&local_5c0,0x1c2,1,2,&local_5c4,"m.get_number_of_columns()",&local_5c8,"5"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5b0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
  ::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
              *)local_220,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)&m.matrix_.operators_,iVar4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_5d8,0x1c4,&local_5e8);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_610,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_624 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220);
    local_628 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_610,&local_620,0x1c4,1,2,&local_624,"m.get_number_of_columns()",&local_628,"6"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_610);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  iVar4 = Gudhi::persistence_matrix::
          Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
          ::get_null_value<int>();
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
  ::
  insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>
              *)local_220,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_38,iVar4);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_648);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_638,0x1c6,&local_648);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_670,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_684 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_number_of_columns
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220);
    local_688 = 7;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_670,&local_680,0x1c6,1,2,&local_684,"m.get_number_of_columns()",&local_688,"7"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_670);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_698,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_698,0x1c7,&local_6a8);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,1,0);
    boost::test_tools::assertion_result::assertion_result(&local_6c0,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6f0,"m.is_zero_entry(1, 0)",0x15);
    boost::unit_test::operator<<(&local_6e0,plVar6,&local_6f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_700,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_6c0,&local_6e0,&local_700,0x1c7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6e0);
    boost::test_tools::assertion_result::~assertion_result(&local_6c0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_710,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_720);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_710,0x1c8,&local_720);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_entry((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,3,0);
    boost::test_tools::assertion_result::assertion_result(&local_738,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_768,"!m.is_zero_entry(3, 0)",0x16);
    boost::unit_test::operator<<(&local_758,plVar6,&local_768);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_778,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_738,&local_758,&local_778,0x1c8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_758);
    boost::test_tools::assertion_result::~assertion_result(&local_738);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_798);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_788,0x1c9,&local_798);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,0);
    boost::test_tools::assertion_result::assertion_result(&local_7b0,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e0,"m.is_zero_column(0)",0x13);
    boost::unit_test::operator<<(&local_7d0,plVar6,&local_7e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_7b0,&local_7d0,&local_7f0,0x1c9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7d0);
    boost::test_tools::assertion_result::~assertion_result(&local_7b0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_810);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_800,0x1ca,&local_810);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,1);
    boost::test_tools::assertion_result::assertion_result(&local_828,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_858,"m.is_zero_column(1)",0x13);
    boost::unit_test::operator<<(&local_848,plVar6,&local_858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_868,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_828,&local_848,&local_868,0x1ca,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_848);
    boost::test_tools::assertion_result::~assertion_result(&local_828);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_878,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_888);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_878,0x1cb,&local_888);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,2);
    boost::test_tools::assertion_result::assertion_result(&local_8a0,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,"m.is_zero_column(2)",0x13);
    boost::unit_test::operator<<(&local_8c0,plVar6,&local_8d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8a0,&local_8c0,&local_8e0,0x1cb,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8c0);
    boost::test_tools::assertion_result::~assertion_result(&local_8a0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_900);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_8f0,0x1cc,&local_900);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,3);
    boost::test_tools::assertion_result::assertion_result(&local_918,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_938,plVar6,&local_948);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_918,&local_938,&local_958,0x1cc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_938);
    boost::test_tools::assertion_result::~assertion_result(&local_918);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_968,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_978);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_968,0x1cd,&local_978);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,4);
    boost::test_tools::assertion_result::assertion_result(&local_990,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,"!m.is_zero_column(4)",0x14);
    boost::unit_test::operator<<(&local_9b0,plVar6,&local_9c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_990,&local_9b0,&local_9d0,0x1cd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9b0);
    boost::test_tools::assertion_result::~assertion_result(&local_990);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_9e0,0x1cf,&local_9f0);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,5);
    boost::test_tools::assertion_result::assertion_result(&local_a08,bVar3);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,"m.is_zero_column(5)",0x13);
    boost::unit_test::operator<<(&local_a28,plVar6,&local_a38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a08,&local_a28,&local_a48,0x1cf,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a28);
    boost::test_tools::assertion_result::~assertion_result(&local_a08);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a68);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_a58,0x1d3,&local_a68);
    bVar3 = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
            ::is_zero_column((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                              *)local_220,6);
    boost::test_tools::assertion_result::assertion_result(&local_a80,(bool)(~bVar3 & 1));
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,"!m.is_zero_column(6)",0x14);
    boost::unit_test::operator<<(&local_aa0,plVar6,&local_ab0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a80,&local_aa0,&local_ac0,0x1d3,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_aa0);
    boost::test_tools::assertion_result::~assertion_result(&local_a80);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ad0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ae0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_ad0,0x1d5,&local_ae0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b08,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_b1c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,0);
    local_b20 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b08,&local_b18,0x1d5,1,2,&local_b1c,"m.get_column_dimension(0)",&local_b20,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b08);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b30,0x1d6,&local_b40);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b68,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_b7c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,1);
    local_b80 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b68,&local_b78,0x1d6,1,2,&local_b7c,"m.get_column_dimension(1)",&local_b80,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b68);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ba0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b90,0x1d7,&local_ba0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bc8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_bdc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,2);
    local_be0 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_bc8,&local_bd8,0x1d7,1,2,&local_bdc,"m.get_column_dimension(2)",&local_be0,"0"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bc8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bf0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_bf0,0x1d8,&local_c00);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c28,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_c3c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,3);
    local_c40 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c28,&local_c38,0x1d8,1,2,&local_c3c,"m.get_column_dimension(3)",&local_c40,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c28);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_c50,0x1d9,&local_c60);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c88,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_c9c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,4);
    local_ca0 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c88,&local_c98,0x1d9,1,2,&local_c9c,"m.get_column_dimension(4)",&local_ca0,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c88);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_cb0,0x1da,&local_cc0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ce8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cf8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_cfc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,5);
    local_d00 = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ce8,&local_cf8,0x1da,1,2,&local_cfc,"m.get_column_dimension(5)",&local_d00,"1"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ce8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d10,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d10,0x1db,&local_d20);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d48,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d58,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_d5c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_column_dimension
                          ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                            *)local_220,6);
    local_d60 = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d48,&local_d58,0x1db,1,2,&local_d5c,"m.get_column_dimension(6)",&local_d60,"2"
              );
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d48);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d70,0x1dd,&local_d80);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_da8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_db8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_dbc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,0);
    local_dc0 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_da8,&local_db8,0x1dd,1,2,&local_dbc,"m.get_pivot(0)",&local_dc0,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_da8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dd0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_de0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_dd0,0x1de,&local_de0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e08,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e1c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,1);
    local_e20 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_e08,&local_e18,0x1de,1,2,&local_e1c,"m.get_pivot(1)",&local_e20,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e08);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e30,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_e30,0x1df,&local_e40);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e68,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e78,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_e7c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,2);
    local_e80 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_e68,&local_e78,0x1df,1,2,&local_e7c,"m.get_pivot(2)",&local_e80,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e68);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ea0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_e90,0x1e0,&local_ea0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ec8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ed8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_edc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,3);
    local_ee0 = 1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_ec8,&local_ed8,0x1e0,1,2,&local_edc,"m.get_pivot(3)",&local_ee0,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ec8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ef0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f00);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_ef0,0x1e1,&local_f00);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f28,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_f3c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,4);
    local_f40 = 2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_f28,&local_f38,0x1e1,1,2,&local_f3c,"m.get_pivot(4)",&local_f40,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f28);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f50,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_f50,0x1e3,&local_f60);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f88,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f98,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_f9c = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,5);
    local_fa0 = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_null_value<unsigned_int>();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_f88,&local_f98,0x1e3,1,2,&local_f9c,"m.get_pivot(5)",&local_fa0,
               "Matrix::template get_null_value<typename Matrix::ID_index>()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f88);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_fb0,0x1e7,&local_fc0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_fe8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ff8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_ffc = Gudhi::persistence_matrix::
                Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                ::get_pivot((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,6);
    local_1000 = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_fe8,&local_ff8,0x1e7,1,2,&local_ffc,"m.get_pivot(6)",&local_1000,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_fe8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1010,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1020);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1010,0x1ea,&local_1020);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1048,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1058,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_105c = Gudhi::persistence_matrix::
                 Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                 ::get_column_with_pivot
                           ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,1);
    local_1060 = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1048,&local_1058,0x1ea,1,2,&local_105c,"m.get_column_with_pivot(1)",
               &local_1060,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1048);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1070,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1080);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1070,0x1eb,&local_1080);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_10a8,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_10bc = Gudhi::persistence_matrix::
                 Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                 ::get_column_with_pivot
                           ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,2);
    local_10c0 = 4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_10a8,&local_10b8,0x1eb,1,2,&local_10bc,"m.get_column_with_pivot(2)",
               &local_10c0,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_10a8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_10d0,0x1ec,&local_10e0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1108,plVar6,(char (*) [1])0x2c220d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1118,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_111c = Gudhi::persistence_matrix::
                 Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                 ::get_column_with_pivot
                           ((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
                             *)local_220,5);
    local_1120 = 6;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
              (&local_1108,&local_1118,0x1ec,1,2,&local_111c,"m.get_column_with_pivot(5)",
               &local_1120,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1108);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  ::~Matrix((Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
             *)local_220);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)&m.matrix_.operators_);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)local_38);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&boundary2.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}